

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.h
# Opt level: O0

Mig_Obj_t * Mig_ManAppendObj(Mig_Man_t *p)

{
  int iVar1;
  int iVar2;
  undefined8 *__s;
  Mig_Obj_t *p_00;
  Mig_Obj_t *pPage;
  Mig_Obj_t *pObj;
  Mig_Man_t *p_local;
  
  if (0x7ffffffe < p->nObjs) {
    __assert_fail("p->nObjs < MIG_NONE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                  ,0xdc,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
  }
  iVar2 = p->nObjs;
  iVar1 = Vec_PtrSize(&p->vPages);
  if (iVar1 * 0x1000 <= iVar2) {
    iVar2 = p->nObjs;
    iVar1 = Vec_PtrSize(&p->vPages);
    if (iVar2 != iVar1 << 0xc) {
      __assert_fail("p->nObjs == (Vec_PtrSize(&p->vPages) << MIG_BASE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                    ,0xe0,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
    }
    __s = (undefined8 *)malloc(0x10020);
    memset(__s,0xff,0x10020);
    *__s = p;
    Vec_PtrPush(&p->vPages,__s + 2);
  }
  iVar2 = p->nObjs;
  p->nObjs = iVar2 + 1;
  p_00 = Mig_ManObj(p,iVar2);
  iVar2 = Mig_ObjIsNone(p_00);
  if (iVar2 != 0) {
    Mig_ObjSetId(p_00,p->nObjs + -1);
    return p_00;
  }
  __assert_fail("Mig_ObjIsNone(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                ,0xea,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
}

Assistant:

static inline Mig_Obj_t * Mig_ManAppendObj( Mig_Man_t * p )
{
    Mig_Obj_t * pObj;
    assert( p->nObjs < MIG_NONE );
    if ( p->nObjs >= (Vec_PtrSize(&p->vPages) << MIG_BASE) )
    {
        Mig_Obj_t * pPage;// int i;
        assert( p->nObjs == (Vec_PtrSize(&p->vPages) << MIG_BASE) );
        pPage = ABC_FALLOC( Mig_Obj_t, MIG_MASK + 3 ); // 1 for mask, 1 for prefix, 1 for sentinel
        *((void **)pPage) = p;
//        *((void ***)(pPage + 1) - 1) = Vec_PtrArray(&p->vPages);
        Vec_PtrPush( &p->vPages, pPage + 1 );
//        if ( *((void ***)(pPage + 1) - 1) != Vec_PtrArray(&p->vPages) )
//            Vec_PtrForEachEntry( Mig_Obj_t *, &p->vPages, pPage, i )
//                *((void ***)pPage - 1) = Vec_PtrArray(&p->vPages);
    }
    pObj = Mig_ManObj( p, p->nObjs++ );
    assert( Mig_ObjIsNone(pObj) );
    Mig_ObjSetId( pObj, p->nObjs-1 );
    return pObj;
}